

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void __thiscall
fmt::v10::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  type in_register_00000014;
  type atVar5 [2];
  char *pcVar6;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  atVar5[1] = in_register_00000014;
  atVar5[0] = error_code;
  local_68.context_.types_ = local_68.types_;
  *(undefined8 *)(this + 0x10) = 0;
  uVar2 = (ulong)(uint)-(int)out;
  if (0 < (int)out) {
    uVar2 = (ulong)out & 0xffffffff;
  }
  uVar4 = (uint)uVar2 | 1;
  uVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if ((long)(uVar2 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar1 * 8)) < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                ,0x189,"negative value");
  }
  if (message.data_ <=
      (char *)(0x1ec - (((ulong)out >> 0x1f & 1) +
                       (uVar2 + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar1 * 8)
                       >> 0x20)))) {
    local_68.types_[0] = string_type;
    local_68.types_[1] = cstring_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = "{}{}";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 4;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         parse_format_specs<fmt::v10::basic_string_view<char>,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_68.parse_funcs_[1] =
         parse_format_specs<char[3],fmt::v10::detail::compile_parse_context<char>>;
    pcVar6 = "{}{}";
    do {
      pcVar3 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) goto LAB_001e9e40;
        pcVar3 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar3 = parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,fmt::v10::basic_string_view<char>,char[3]>&>
                           (pcVar6,"",&local_68);
      }
      pcVar6 = pcVar3;
    } while (pcVar3 != "");
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23d2c3;
    args.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
    args.desc_ = 0xcd;
    fmt.size_ = 4;
    fmt.data_ = "{}{}";
    local_68.types_ = atVar5;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = message.data_;
    vformat_to<fmt::v10::appender,_0>((appender)this,fmt,args);
  }
  local_68.types_[0] = cstring_type;
  local_68.types_[1] = int_type;
  local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ = "{}{}";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 4;
  local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
  local_68.parse_funcs_[0] =
       parse_format_specs<char[7],fmt::v10::detail::compile_parse_context<char>>;
  local_68.parse_funcs_[1] = parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
  pcVar6 = "{}{}";
  local_68.context_.types_ = local_68.types_;
  do {
    pcVar3 = pcVar6 + 1;
    if (*pcVar6 == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
LAB_001e9e40:
        throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = pcVar6 + 2;
    }
    else if (*pcVar6 == '{') {
      pcVar3 = parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[7],int>&>
                         (pcVar6,"",&local_68);
    }
    pcVar6 = pcVar3;
    if (pcVar3 == "") {
      local_68.types_ = (type  [2])0x23cd40;
      args_00.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_68;
      args_00.desc_ = 0x1c;
      fmt_00.size_ = 4;
      fmt_00.data_ = "{}{}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (ulong)out & 0xffffffff;
      vformat_to<fmt::v10::appender,_0>((appender)this,fmt_00,args_00);
      if (*(ulong *)(this + 0x10) < 0x1f5) {
        return;
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
                  ,0x3f,anon_var_dwarf_6dd7b0 + 9);
    }
  } while( true );
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) noexcept {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    fmt::format_to(it, FMT_STRING("{}{}"), message, SEP);
  fmt::format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}